

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.cpp
# Opt level: O0

QDataStream * __thiscall QDataStream::writeBytes(QDataStream *this,char *s,qint64 len)

{
  bool bVar1;
  long in_RDX;
  qint64 in_RSI;
  QDataStream *in_RDI;
  QDataStream *s_00;
  QDataStream *in_stack_fffffffffffffff8;
  
  if (in_RDX < 0) {
    in_RDI->q_status = '\x03';
  }
  else if ((((in_RDI->dev != (QIODevice *)0x0) && (in_RDI->q_status == '\0')) &&
           (s_00 = in_RDI, bVar1 = writeQSizeType(in_RDI,0x485fe3), bVar1)) && (0 < in_RDX)) {
    writeRawData(in_stack_fffffffffffffff8,(char *)s_00,in_RSI);
  }
  return in_RDI;
}

Assistant:

QDataStream &QDataStream::writeBytes(const char *s, qint64 len)
{
    if (len < 0) {
        q_status = WriteFailed;
        return *this;
    }
    CHECK_STREAM_WRITE_PRECOND(*this)
    // Write length then, if any, content
    if (writeQSizeType(*this, len) && len > 0)
        writeRawData(s, len);
    return *this;
}